

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  cpp *this_00;
  FieldDescriptor *pFVar1;
  pointer pcVar2;
  int iVar3;
  LogMessage *pLVar4;
  FieldGenerator *pFVar5;
  char *pcVar6;
  pointer puVar7;
  undefined8 *puVar8;
  pointer ppFVar9;
  Descriptor *pDVar10;
  AlphaNum *b;
  long *plVar11;
  pointer ppFVar12;
  char cVar13;
  uint uVar14;
  int extraout_EDX;
  uint i;
  MessageGenerator *field;
  FieldDescriptor *field_00;
  ulong extraout_RDX;
  FieldDescriptor *field_01;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  AlphaNum *c;
  long *plVar19;
  int iVar20;
  ulong uVar22;
  uint uVar23;
  FieldGeneratorMap *pFVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  MessageGenerator *pMVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  bool bVar34;
  Hex hex;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  undefined1 local_298 [60];
  int local_25c;
  int local_258;
  int local_254;
  FieldGeneratorMap *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  undefined1 local_1b0 [48];
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  string m;
  string result;
  string local_110;
  undefined1 local_f0 [48];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  ulong uVar21;
  
  pDVar10 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar10 + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar10 + 8));
    if (((this->options_).enforce_lite == true) ||
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3)) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf64);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)local_298,
                          "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)local_298);
    }
    io::Printer::Print(printer,
                       "if (_internal_metadata_.have_unknown_fields()) {\n  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n}\n"
                      );
    pcVar17 = 
    "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = cached_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
    ;
    goto LAB_00259792;
  }
  if ((1 < this->num_required_fields_) && (*(int *)(*(long *)(pDVar10 + 0x10) + 0x8c) != 3)) {
    io::Printer::Print(printer,
                       "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar10 + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"size_t total_size = 0;\n");
    ppFVar9 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar12 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar12 != ppFVar9) {
      pMVar28 = (MessageGenerator *)0x0;
      field = this;
      do {
        this_00 = (cpp *)ppFVar9[(long)pMVar28];
        if (*(int *)(this_00 + 0x4c) == 2) {
          FieldName_abi_cxx11_((string *)local_298,this_00,(FieldDescriptor *)field);
          io::Printer::Print(printer,"\nif (has_$name$()) {\n","name",(string *)local_298);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                    (printer,(FieldDescriptor *)this_00);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          ppFVar9 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar12 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        pMVar28 = (MessageGenerator *)((long)&pMVar28->descriptor_ + 1);
        field = (MessageGenerator *)((long)ppFVar12 - (long)ppFVar9 >> 3);
      } while (pMVar28 < field);
    }
    io::Printer::Print(printer,"\nreturn total_size;\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    pDVar10 = this->descriptor_;
  }
  c = (AlphaNum *)0x3621c4;
  io::Printer::Print(printer,
                     "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(pDVar10 + 8));
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"size_t total_size = 0;\n\n");
  pDVar10 = this->descriptor_;
  if (0 < *(int *)(pDVar10 + 0x68)) {
    io::Printer::Print(printer,"total_size += _extensions_.ByteSize();\n\n");
    pDVar10 = this->descriptor_;
  }
  if (*(int *)(*(long *)(pDVar10 + 0x10) + 0x8c) != 3) {
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(pDVar10 + 0x10) + 0xa0) + 0xa8) != 3)) {
      pcVar17 = 
      "if (_internal_metadata_.have_unknown_fields()) {\n  total_size +=\n    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n      unknown_fields());\n}\n"
      ;
    }
    else {
      pcVar17 = "total_size += unknown_fields().size();\n\n";
    }
    io::Printer::Print(printer,pcVar17);
  }
  if ((this->num_required_fields_ < 2) ||
     (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3)) {
    ppFVar9 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar12 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar12 != ppFVar9) {
      uVar29 = 0;
      do {
        pFVar1 = ppFVar9[uVar29];
        if (*(int *)(pFVar1 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar1);
          FieldName_abi_cxx11_((string *)local_298,(cpp *)pFVar1,field_00);
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)local_298);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          ppFVar9 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar12 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < (ulong)((long)ppFVar12 - (long)ppFVar9 >> 3));
      goto LAB_00258f94;
    }
  }
  else {
    RequiredFieldsBitMask(&masks_for_has_bits,this);
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"if (","");
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_00258b8e:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf54);
      pLVar4 = internal::LogMessage::operator<<
                         ((LogMessage *)local_298,"CHECK failed: !parts.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
      internal::LogMessage::~LogMessage((LogMessage *)local_298);
    }
    else {
      pcVar17 = local_1b0 + 0x10;
      uVar29 = 0;
      puVar7 = masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      b = (AlphaNum *)
          masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish;
      do {
        hex.value = (ulong)puVar7[uVar29];
        if (hex.value != 0) {
          local_298._0_8_ = "0x";
          local_298._8_8_ = (char *)0x2;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_1b0,hex);
          StrCat_abi_cxx11_(&m,(protobuf *)local_298,(AlphaNum *)local_1b0,b);
          local_298._0_8_ = "((_has_bits_[";
          local_298._8_8_ = (char *)0xd;
          local_1b0._0_8_ = pcVar17;
          pcVar6 = FastInt32ToBufferLeft((int32)uVar29,pcVar17);
          local_1b0._8_8_ = (long)pcVar6 - (long)pcVar17;
          local_c0.piece_data_ = "] & ";
          local_c0.piece_size_ = 4;
          result._M_dataplus = m._M_dataplus;
          result._M_string_length = m._M_string_length;
          local_f0._0_8_ = ") ^ ";
          local_f0._8_8_ = 4;
          local_60.piece_data_ = m._M_dataplus._M_p;
          local_60.piece_size_ = m._M_string_length;
          local_90.piece_data_ = ")";
          local_90.piece_size_ = 1;
          c = (AlphaNum *)&result;
          StrCat_abi_cxx11_(&local_110,(protobuf *)local_298,(AlphaNum *)local_1b0,&local_c0,c,
                            (AlphaNum *)local_f0,&local_60,&local_90,
                            (AlphaNum *)
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                     &local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          puVar7 = masks_for_has_bits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          b = (AlphaNum *)
              masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)m._M_dataplus._M_p != &m.field_2) {
            operator_delete(m._M_dataplus._M_p,m.field_2._M_allocated_capacity + 1);
            puVar7 = masks_for_has_bits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            b = (AlphaNum *)
                masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < (ulong)((long)b - (long)puVar7 >> 2));
      if (parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00258b8e;
    }
    if ((char *)((long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) == (char *)0x20) {
      result._M_dataplus._M_p = (pointer)&result.field_2;
      pcVar2 = ((parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&result,pcVar2,
                 pcVar2 + (parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    }
    else {
      local_298._0_8_ = "(";
      local_298._8_8_ = (char *)0x1;
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_f0,(protobuf *)&parts,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\n       | ",
                 (char *)((long)parts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)parts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      local_1b0._0_8_ = local_f0._0_8_;
      local_1b0._8_8_ = local_f0._8_8_;
      local_c0.piece_data_ = ")";
      local_c0.piece_size_ = 1;
      StrCat_abi_cxx11_(&result,(protobuf *)local_298,(AlphaNum *)local_1b0,&local_c0,c);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
    }
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    std::__cxx11::string::append((char *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
    uVar29 = 0xf;
    if (local_1e8 != local_1d8) {
      uVar29 = local_1d8[0];
    }
    if (uVar29 < (ulong)(local_220 + local_1e0)) {
      uVar29 = 0xf;
      if (local_228 != local_218) {
        uVar29 = local_218[0];
      }
      if (uVar29 < (ulong)(local_220 + local_1e0)) goto LAB_00258d5a;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_1e8);
    }
    else {
LAB_00258d5a:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_228);
    }
    local_208 = &local_1f8;
    plVar19 = puVar8 + 2;
    if ((long *)*puVar8 == plVar19) {
      local_1f8 = *plVar19;
      uStack_1f0 = puVar8[3];
    }
    else {
      local_1f8 = *plVar19;
      local_208 = (long *)*puVar8;
    }
    local_200 = puVar8[1];
    *puVar8 = plVar19;
    puVar8[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_208);
    plVar11 = plVar19 + 2;
    if ((long *)*plVar19 == plVar11) {
      local_170 = *plVar11;
      lStack_168 = plVar19[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar11;
      local_180 = (long *)*plVar19;
    }
    local_178 = plVar19[1];
    *plVar19 = (long)plVar11;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    io::Printer::Print(printer,(char *)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    io::Printer::Indent(printer);
    ppFVar9 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar12 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar12 != ppFVar9) {
      uVar29 = 0;
      do {
        pFVar1 = ppFVar9[uVar29];
        if (*(int *)(pFVar1 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar1);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Print(printer,"\n");
          ppFVar9 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppFVar12 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < (ulong)((long)ppFVar12 - (long)ppFVar9 >> 3));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(masks_for_has_bits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ppFVar9 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar12 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_00258f94:
    if (ppFVar12 != ppFVar9) {
      local_250 = &this->field_generators_;
      iVar32 = 0;
      iVar27 = -1;
      do {
        if (iVar32 == iVar27) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xfd8);
          pLVar4 = internal::LogMessage::operator<<
                             ((LogMessage *)local_298,"CHECK failed: (i) != (last_i): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
          internal::LogMessage::~LogMessage((LogMessage *)local_298);
        }
        ppFVar9 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar12 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar29 = (long)ppFVar12 - (long)ppFVar9 >> 3;
        uVar16 = (ulong)iVar32;
        iVar15 = iVar32;
        if (uVar16 < uVar29) {
          do {
            if (*(int *)(ppFVar9[uVar16] + 0x4c) != 2) break;
            uVar16 = uVar16 + 1;
          } while (uVar16 < uVar29);
          iVar15 = (int)uVar16;
          uVar16 = (ulong)iVar15;
        }
        if (uVar16 < uVar29) {
          do {
            pFVar1 = ppFVar9[uVar16];
            if (*(int *)(pFVar1 + 0x4c) != 3) {
              uVar29 = (long)ppFVar12 - (long)ppFVar9 >> 3;
              break;
            }
            anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar1);
            pFVar5 = FieldGeneratorMap::get(local_250,pFVar1);
            (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
            io::Printer::Print(printer,"\n");
            uVar16 = uVar16 + 1;
            ppFVar9 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppFVar12 = (this->optimized_order_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            uVar29 = (long)ppFVar12 - (long)ppFVar9 >> 3;
          } while (uVar16 < uVar29);
          iVar15 = (int)uVar16;
          uVar16 = (ulong)iVar15;
        }
        iVar27 = iVar32;
        if (uVar16 < uVar29) {
          uVar30 = 0xffffffff;
          uVar23 = 0;
          iVar31 = -1;
          uVar21 = 0xffffffff;
          do {
            iVar20 = (int)uVar21;
            iVar26 = (int)uVar30;
            uVar30 = uVar16 & 0xffffffff;
            iVar15 = (int)uVar16;
            pFVar1 = ppFVar9[uVar16];
            iVar3 = iVar15;
            if ((*(uint *)(pFVar1 + 0x4c) & 0xfffffffe) == 2) goto LAB_0025918a;
            uVar18 = 0;
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
              if (pFVar1[0x50] == (FieldDescriptor)0x0) {
                plVar19 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar1 + 0x68) == 0) {
                plVar19 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
              }
              else {
                plVar19 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
              }
              uVar18 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((long)pFVar1 - *plVar19) >> 3) * 0x3cf3cf3d];
            }
            uVar14 = uVar18 + 7;
            if (-1 < (int)uVar18) {
              uVar14 = uVar18;
            }
            uVar22 = uVar30;
            iVar3 = (int)uVar14 >> 3;
            if ((iVar31 != -1) && (uVar22 = uVar21, iVar3 = iVar31, (int)uVar14 >> 3 != iVar31))
            goto LAB_00259194;
            iVar31 = iVar3;
            iVar20 = (int)uVar22;
            uVar23 = uVar23 | 1 << (uVar18 & 0x1f);
            uVar16 = uVar16 + 1;
            uVar21 = uVar22;
          } while (uVar16 < uVar29);
          iVar3 = (int)uVar16;
          iVar26 = iVar15;
LAB_0025918a:
          iVar15 = iVar3;
          if (iVar31 != -1) {
LAB_00259194:
            local_25c = iVar20;
            local_254 = iVar15;
            if (iVar20 == -1) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x1013);
              pLVar4 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_298,
                                  "CHECK failed: (-1) != (last_chunk_start): ");
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
              internal::LogMessage::~LogMessage((LogMessage *)local_298);
            }
            if (iVar26 == -1) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x1014);
              pLVar4 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_298,"CHECK failed: (-1) != (last_chunk_end): "
                                 );
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
              internal::LogMessage::~LogMessage((LogMessage *)local_298);
            }
            local_258 = iVar32;
            if (uVar23 == 0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x1015);
              pLVar4 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_298,"CHECK failed: (0) != (last_chunk_mask): "
                                 );
              internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
              internal::LogMessage::~LogMessage((LogMessage *)local_298);
              uVar18 = 0;
              uVar29 = extraout_RDX;
            }
            else {
              uVar18 = 0;
              uVar29 = (ulong)uVar23;
              do {
                uVar14 = (uint)uVar29;
                uVar18 = uVar18 + (uVar14 & 1);
                uVar29 = uVar29 >> 1;
              } while (1 < uVar14);
            }
            bVar34 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
            cVar13 = local_25c != iVar26 && bVar34;
            iVar27 = (int)CONCAT71((int7)(uVar29 >> 8),cVar13);
            if (local_25c != iVar26 && bVar34) {
              if ((int)uVar18 < 2) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0x101f);
                pLVar4 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_298,"CHECK failed: (2) <= (count): ");
                internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
LAB_00259350:
                internal::LogMessage::~LogMessage((LogMessage *)local_298);
                iVar27 = extraout_EDX;
              }
              else if (8 < uVar18) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_298,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0x1020);
                pLVar4 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_298,"CHECK failed: (8) >= (count): ");
                internal::LogFinisher::operator=((LogFinisher *)local_1b0,pLVar4);
                goto LAB_00259350;
              }
              SimpleItoa_abi_cxx11_
                        ((string *)local_298,(protobuf *)(ulong)(uint)(iVar31 << 3),iVar27);
              SimpleItoa_abi_cxx11_((string *)local_1b0,(protobuf *)(ulong)uVar23,i);
              io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                                 (string *)local_298,"mask",(string *)local_1b0);
              if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
                operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
              }
              if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
              }
              io::Printer::Indent(printer);
            }
            if (local_25c <= iVar26) {
              lVar33 = (long)local_25c;
              iVar27 = (iVar26 - local_25c) + 1;
              do {
                pFVar1 = (this->optimized_order_).
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar33];
                pFVar5 = FieldGeneratorMap::get(local_250,pFVar1);
                anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar1)
                ;
                if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
                  local_298._0_8_ = local_298 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"this->","");
                  bVar34 = anon_unknown_0::EmitFieldNonDefaultCondition
                                     (printer,(string *)local_298,pFVar1);
                  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
                  }
                  (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
                  if (bVar34) goto LAB_002594f4;
                }
                else {
                  FieldName_abi_cxx11_((string *)local_298,(cpp *)pFVar1,field_01);
                  io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)local_298);
                  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
                    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
                  }
                  io::Printer::Indent(printer);
                  (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
LAB_002594f4:
                  io::Printer::Outdent(printer);
                  io::Printer::Print(printer,"}\n\n");
                }
                lVar33 = lVar33 + 1;
                iVar27 = iVar27 + -1;
              } while (iVar27 != 0);
            }
            iVar27 = local_258;
            iVar15 = local_254;
            if (cVar13 != '\0') {
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n");
              iVar27 = local_258;
              iVar15 = local_254;
            }
          }
        }
        iVar32 = iVar15;
      } while ((ulong)(long)iVar32 <
               (ulong)((long)(this->optimized_order_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->optimized_order_).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  pDVar10 = this->descriptor_;
  if (0 < *(int *)(pDVar10 + 0x38)) {
    pFVar24 = (FieldGeneratorMap *)0x0;
    do {
      io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",
                         *(string **)(*(long *)(pDVar10 + 0x40) + (long)pFVar24 * 0x30));
      io::Printer::Indent(printer);
      lVar33 = *(long *)(this->descriptor_ + 0x40);
      local_250 = pFVar24;
      if (0 < *(int *)(lVar33 + 0x1c + (long)pFVar24 * 0x30)) {
        lVar25 = 0;
        do {
          pFVar1 = *(FieldDescriptor **)
                    (*(long *)(lVar33 + 0x20 + (long)pFVar24 * 0x30) + lVar25 * 8);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar1);
          UnderscoresToCamelCase((string *)local_298,*(string **)pFVar1,true);
          io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)local_298);
          if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
            operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
          (*pFVar5->_vptr_FieldGenerator[0x17])(pFVar5,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar25 = lVar25 + 1;
          lVar33 = *(long *)(this->descriptor_ + 0x40);
        } while (lVar25 < *(int *)(lVar33 + 0x1c + (long)pFVar24 * 0x30));
      }
      plVar19 = *(long **)(lVar33 + (long)pFVar24 * 0x30);
      local_298._0_8_ = local_298 + 0x10;
      lVar33 = *plVar19;
      std::__cxx11::string::_M_construct<char*>((string *)local_298,lVar33,plVar19[1] + lVar33);
      if ((char *)local_298._8_8_ != (char *)0x0) {
        pcVar17 = (char *)0x0;
        do {
          if ((byte)(*(char *)(local_298._0_8_ + (long)pcVar17) + 0x9fU) < 0x1a) {
            *(char *)(local_298._0_8_ + (long)pcVar17) =
                 *(char *)(local_298._0_8_ + (long)pcVar17) + -0x20;
          }
          pcVar17 = pcVar17 + 1;
        } while ((char *)local_298._8_8_ != pcVar17);
      }
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         (string *)local_298);
      pFVar24 = local_250;
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pFVar24 = (FieldGeneratorMap *)((long)&pFVar24->descriptor_ + 1);
      pDVar10 = this->descriptor_;
    } while ((long)pFVar24 < (long)*(int *)(pDVar10 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  io::Printer::Print(printer,
                     "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = cached_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                    );
  io::Printer::Outdent(printer);
  pcVar17 = "}\n";
LAB_00259792:
  io::Printer::Print(printer,pcVar17);
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "if (_internal_metadata_.have_unknown_fields()) {\n"
      "  total_size += ::google::protobuf::internal::WireFormat::\n"
      "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
      "}\n");
    printer->Print(
      "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = cached_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    printer->Print(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();
    printer->Print("size_t total_size = 0;\n");
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_required()) {
        printer->Print("\n"
                       "if (has_$name$()) {\n",
                       "name", FieldName(field));
        printer->Indent();
        PrintFieldComment(printer, field);
        field_generators_.get(field).GenerateByteSize(printer);
        printer->Outdent();
        printer->Print("}\n");
      }
    }
    printer->Print("\n"
                   "return total_size;\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Print(
    "size_t total_size = 0;\n"
    "\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "if (_internal_metadata_.have_unknown_fields()) {\n"
        "  total_size +=\n"
        "    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
        "      unknown_fields());\n"
        "}\n");
    } else {
      printer->Print(
        "total_size += unknown_fields().size();\n"
        "\n");
    }
  }

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    printer->Print((string("if (") +
                    ConditionalToCheckBitmasks(masks_for_has_bits) +
                    ") {  // All required fields are present.\n").c_str());
    printer->Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
    printer->Outdent();
    printer->Print("} else {\n"  // the slow path
                   "  total_size += RequiredFieldsByteSizeFallback();\n"
                   "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      printer->Print("if (has_$name$()) {\n",
                     "name", FieldName(field));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Outdent();
      printer->Print("}\n");
    }
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Skip required fields.
    for (; i < optimized_order_.size() &&
         optimized_order_[i]->is_required(); i++) {
    }

    // Handle repeated fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      PrintFieldComment(printer, field);
      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateByteSize(printer);
      printer->Print("\n");
    }

    // Handle optional (non-repeated/oneof) fields.
    //
    // These are handled in chunks of 8.  The first chunk is
    // the non-requireds-non-repeateds-non-unions-non-extensions in
    //  descriptor_->field(0), descriptor_->field(1), ... descriptor_->field(7),
    // and the second chunk is the same for
    //  descriptor_->field(8), descriptor_->field(9), ...
    //  descriptor_->field(15),
    // etc.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || field->is_required()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit checks for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        PrintFieldComment(printer, field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          printer->Print(
            "if (has_$name$()) {\n",
            "name", FieldName(field));
          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Without field presence: field is serialized only if it has a
          // non-default value.
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "this->", field);
        }

        generator.GenerateByteSize(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print(
            "}\n"
            "\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      PrintFieldComment(printer, field);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    printer->Print("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = cached_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}